

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O0

bool_t tmDateIsValid2(octet *date)

{
  bool_t bVar1;
  byte *in_RDI;
  bool local_9;
  
  bVar1 = memIsValid(in_RDI,6);
  local_9 = false;
  if (bVar1 != 0) {
    bVar1 = tmDateIsValid((ulong)*in_RDI * 10 + (ulong)in_RDI[1] + 2000,
                          (ulong)in_RDI[2] * 10 + (ulong)in_RDI[3],
                          (ulong)in_RDI[4] * 10 + (ulong)in_RDI[5]);
    local_9 = bVar1 != 0;
  }
  return (bool_t)local_9;
}

Assistant:

bool_t tmDateIsValid2(const octet date[6])
{
	return memIsValid(date, 6) && 
		tmDateIsValid(
			(size_t)10 * date[0] + date[1] + 2000,
			(size_t)10 * date[2] + date[3],
			(size_t)10 * date[4] + date[5]);
}